

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execChkCmp2<(moira::Core)2,(moira::Instr)145,(moira::Mode)10,4>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  u32 uVar3;
  bool local_43;
  bool local_42;
  bool local_41;
  u32 local_38;
  i32 compare;
  i32 bound2;
  i32 bound1;
  u32 data2;
  u32 data1;
  u32 ea;
  int dst;
  int src;
  u32 ext;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  dst = (int)uVar1;
  ea = opcode & 7;
  data1 = (u32)(uVar1 >> 0xc);
  src._2_2_ = opcode;
  _ext = this;
  readExt<(moira::Core)2>(this);
  readOp<(moira::Core)2,(moira::Mode)10,4,0ull>(this,ea,&data2,(u32 *)&bound1);
  uVar2 = readM<(moira::Core)2,(moira::Mode)10,4,0ull>(this,data2 + 4);
  uVar3 = SEXT<4>((ulong)(uint)bound1);
  uVar2 = SEXT<4>((ulong)uVar2);
  local_38 = readR<4>(this,data1);
  if ((int)data1 < 8) {
    local_38 = SEXT<4>((long)(int)local_38);
  }
  if ((int)uVar3 < (int)uVar2) {
    local_41 = (int)local_38 < (int)uVar3 || (int)uVar2 < (int)local_38;
    (this->reg).sr.c = local_41;
  }
  else {
    local_42 = (int)uVar2 < (int)local_38 || (int)local_38 < (int)uVar3;
    (this->reg).sr.c = local_42;
  }
  local_43 = local_38 == uVar3 || local_38 == uVar2;
  (this->reg).sr.z = local_43;
  if (((dst & 0x800U) == 0) || (((this->reg).sr.c & 1U) == 0)) {
    prefetch<(moira::Core)2,4ull>(this);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x17));
  }
  else {
    execException<(moira::Core)2>(this,CHK,0);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x28));
  }
  return;
}

Assistant:

void
Moira::execChkCmp2(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u32 ext = queue.irc;
    int src = _____________xxx(opcode);
    int dst = xxxx____________(ext);
    u32 ea, data1, data2;

    readExt<C>();

    readOp<C, M, S>(src, &ea, &data1);
    data2 = readM<C, M, S>(ea + S);

    if (MOIRA_MIMIC_MUSASHI) {

        auto bound1 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data1 : SEXT<S>(data1);
        auto bound2 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data2 : SEXT<S>(data2);
        i32 compare = readR<S>(dst);
        if (dst < 8) compare = SEXT<S>(compare);

        if (bound1 < bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare > bound2 || compare < bound1;
        }
        reg.sr.z = compare == bound1 || compare == bound2;

    } else {

        i32 bound1 = SEXT<S>(data1);
        i32 bound2 = SEXT<S>(data2);
        i32 compare = dst < 8 ? SEXT<S>(readR(dst)) : readR(dst);

        if (bound1 <= bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare < bound1 && compare > bound2;
        }
        reg.sr.z = compare == bound1 || compare == bound2;
        setUndefinedCHK2<C, S>(bound1, bound2, compare);
    }

    if ((ext & 0x800) && reg.sr.c) {

        execException<C>(M68kException::CHK);
        CYCLES_68020(40)

    } else {

        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DI   ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IX   ( 0,  0, 25,        0,  0, 25,        0,  0, 25)
        CYCLES_AW   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AL   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DIPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IXPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
    }

    FINALIZE
}